

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  bool bVar5;
  string help;
  string init;
  string local_68;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  ComputePrefixes(this);
  if (((this->super_cmFindCommon).SearchFrameworkFirst == false) &&
     ((this->super_cmFindCommon).SearchFrameworkOnly != true)) {
    bVar5 = false;
  }
  else {
    psVar4 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = psVar4 != psVar1;
    if (bVar5) {
      bVar3 = SearchFrameworkPrefix(this,psVar4);
      while (!bVar3) {
        psVar4 = psVar4 + 1;
        bVar5 = psVar4 != psVar1;
        if (psVar4 == psVar1) break;
        bVar3 = SearchFrameworkPrefix(this,psVar4);
      }
    }
  }
  if ((bVar5 == false) &&
     (((this->super_cmFindCommon).SearchAppBundleFirst != false ||
      ((this->super_cmFindCommon).SearchAppBundleOnly == true)))) {
    psVar4 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = psVar4 != psVar1;
    if (bVar5) {
      bVar3 = SearchAppBundlePrefix(this,psVar4);
      while (!bVar3) {
        psVar4 = psVar4 + 1;
        bVar5 = psVar4 != psVar1;
        if (psVar4 == psVar1) break;
        bVar3 = SearchAppBundlePrefix(this,psVar4);
      }
    }
  }
  if (((bVar5 == false) && ((this->super_cmFindCommon).SearchFrameworkOnly == false)) &&
     ((this->super_cmFindCommon).SearchAppBundleOnly == false)) {
    psVar4 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = psVar4 != psVar1;
    if (bVar5) {
      bVar3 = SearchPrefix(this,psVar4);
      while (!bVar3) {
        psVar4 = psVar4 + 1;
        bVar5 = psVar4 != psVar1;
        if (psVar4 == psVar1) break;
        bVar3 = SearchPrefix(this,psVar4);
      }
    }
  }
  if ((bVar5 == false) && ((this->super_cmFindCommon).SearchFrameworkLast == true)) {
    psVar4 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = psVar4 != psVar1;
    if (bVar5) {
      bVar3 = SearchFrameworkPrefix(this,psVar4);
      while (!bVar3) {
        psVar4 = psVar4 + 1;
        bVar5 = psVar4 != psVar1;
        if (psVar4 == psVar1) break;
        bVar3 = SearchFrameworkPrefix(this,psVar4);
      }
    }
  }
  if ((bVar5 == false) && ((this->super_cmFindCommon).SearchAppBundleLast == true)) {
    psVar4 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = psVar4 != psVar1;
    if (bVar5) {
      bVar3 = SearchAppBundlePrefix(this,psVar4);
      while (!bVar3) {
        psVar4 = psVar4 + 1;
        bVar5 = psVar4 != psVar1;
        if (psVar4 == psVar1) break;
        bVar3 = SearchAppBundlePrefix(this,psVar4);
      }
    }
  }
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  if (bVar5 == false) {
    pcVar2 = (this->Variable)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (this->Variable)._M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00217bf3;
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_68,&this->FileFound);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00217bf3;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_00217bf3:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"The directory containing a CMake configuration file for ","");
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_68);
  cmMakefile::AddCacheDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable,local_48,
             local_68._M_dataplus._M_p,PATH,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return bVar5;
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  std::string help =
    "The directory containing a CMake configuration file for ";
  help += this->Name;
  help += ".";
  // We force the value since we do not get here if it was already set.
  this->Makefile->AddCacheDefinition(this->Variable, init.c_str(),
                                     help.c_str(), cmStateEnums::PATH, true);
  return found;
}